

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

_Bool upb_MiniTable_SetSubMessage(upb_MiniTable *table,upb_MiniTableField *field,upb_MiniTable *sub)

{
  char cVar1;
  upb_MiniTableSubInternal *table_subs;
  int idx;
  _Bool table_is_map;
  _Bool sub_is_map;
  upb_MiniTable *sub_local;
  upb_MiniTableField *field_local;
  upb_MiniTable *table_local;
  
  if ((table->fields_dont_copy_me__upb_internal_use_only <= field) &&
     (field < table->fields_dont_copy_me__upb_internal_use_only +
              (int)(uint)table->field_count_dont_copy_me__upb_internal_use_only)) {
    if (sub == (upb_MiniTable *)0x0) {
      __assert_fail("sub",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/link.c"
                    ,0x20,
                    "_Bool upb_MiniTable_SetSubMessage(upb_MiniTable *, upb_MiniTableField *, const upb_MiniTable *)"
                   );
    }
    cVar1 = (char)((sub->ext_dont_copy_me__upb_internal_use_only & 4) >> 2);
    if (field->descriptortype_dont_copy_me__upb_internal_use_only == '\n') {
      if (cVar1 != '\0') {
        return false;
      }
    }
    else {
      if (field->descriptortype_dont_copy_me__upb_internal_use_only != '\v') {
        return false;
      }
      if (cVar1 != '\0') {
        if ((table->ext_dont_copy_me__upb_internal_use_only & 4) != 0) {
          return false;
        }
        field->mode_dont_copy_me__upb_internal_use_only =
             field->mode_dont_copy_me__upb_internal_use_only & 0xfc;
      }
    }
    *table->subs_dont_copy_me__upb_internal_use_only
     [(int)(uint)field->submsg_index_dont_copy_me__upb_internal_use_only].
     submsg_dont_copy_me__upb_internal_use_only = sub;
    return true;
  }
  __assert_fail("(uintptr_t)table->fields_dont_copy_me__upb_internal_use_only <= (uintptr_t)field && (uintptr_t)field < (uintptr_t)(table->fields_dont_copy_me__upb_internal_use_only + table->field_count_dont_copy_me__upb_internal_use_only)"
                ,
                "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/upb/mini_descriptor/link.c"
                ,0x1f,
                "_Bool upb_MiniTable_SetSubMessage(upb_MiniTable *, upb_MiniTableField *, const upb_MiniTable *)"
               );
}

Assistant:

bool upb_MiniTable_SetSubMessage(upb_MiniTable* table,
                                 upb_MiniTableField* field,
                                 const upb_MiniTable* sub) {
  UPB_ASSERT((uintptr_t)table->UPB_PRIVATE(fields) <= (uintptr_t)field &&
             (uintptr_t)field < (uintptr_t)(table->UPB_PRIVATE(fields) +
                                            table->UPB_PRIVATE(field_count)));
  UPB_ASSERT(sub);

  const bool sub_is_map = sub->UPB_PRIVATE(ext) & kUpb_ExtMode_IsMapEntry;

  switch (field->UPB_PRIVATE(descriptortype)) {
    case kUpb_FieldType_Message:
      if (sub_is_map) {
        const bool table_is_map =
            table->UPB_PRIVATE(ext) & kUpb_ExtMode_IsMapEntry;
        if (UPB_UNLIKELY(table_is_map)) return false;

        field->UPB_PRIVATE(mode) =
            (field->UPB_PRIVATE(mode) & ~kUpb_FieldMode_Mask) |
            kUpb_FieldMode_Map;
      }
      break;

    case kUpb_FieldType_Group:
      if (UPB_UNLIKELY(sub_is_map)) return false;
      break;

    default:
      return false;
  }

  int idx = field->UPB_PRIVATE(submsg_index);
  upb_MiniTableSubInternal* table_subs = (void*)table->UPB_PRIVATE(subs);
  // TODO: Add this assert back once YouTube is updated to not call
  // this function repeatedly.
  // UPB_ASSERT(UPB_PRIVATE(_upb_MiniTable_IsEmpty)(table_sub->submsg));
  memcpy((void*)table_subs[idx].UPB_PRIVATE(submsg), &sub, sizeof(void*));
  return true;
}